

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

UBool ucm_checkValidity(UCMTable *table,UCMStates *baseStates)

{
  int32_t iVar1;
  UCMapping *pUVar2;
  anon_union_4_2_095b93d3_for_b *local_40;
  UBool local_2d;
  UBool isOK;
  int32_t count;
  UCMapping *mLimit;
  UCMapping *m;
  UCMStates *baseStates_local;
  UCMTable *table_local;
  
  mLimit = table->mappings;
  pUVar2 = mLimit + table->mappingsLength;
  local_2d = '\x01';
  for (; mLimit < pUVar2; mLimit = mLimit + 1) {
    if (mLimit->bLen < '\x05') {
      local_40 = &mLimit->b;
    }
    else {
      local_40 = (anon_union_4_2_095b93d3_for_b *)(table->bytes + (mLimit->b).idx);
    }
    iVar1 = ucm_countChars(baseStates,local_40->bytes,(int)mLimit->bLen);
    if (iVar1 < 1) {
      ucm_printMapping(table,mLimit,_stderr);
      local_2d = '\0';
    }
  }
  return local_2d;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_checkValidity(UCMTable *table, UCMStates *baseStates) {
    UCMapping *m, *mLimit;
    int32_t count;
    UBool isOK;

    m=table->mappings;
    mLimit=m+table->mappingsLength;
    isOK=TRUE;

    while(m<mLimit) {
        count=ucm_countChars(baseStates, UCM_GET_BYTES(table, m), m->bLen);
        if(count<1) {
            ucm_printMapping(table, m, stderr);
            isOK=FALSE;
        }
        ++m;
    }

    return isOK;
}